

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O0

bool glu::(anonymous_namespace)::areVertexArrayLocationsValid<glu::VertexArrayBinding_const*>
               (VertexArrayBinding *first,VertexArrayBinding *end)

{
  bool bVar1;
  _Self local_88 [3];
  _Self local_70;
  undefined4 local_64;
  BindingPoint *local_60;
  BindingPoint *binding;
  VertexArrayBinding *cur;
  set<int,_std::less<int>,_std::allocator<int>_> usedLocations;
  VertexArrayBinding *end_local;
  VertexArrayBinding *first_local;
  
  usedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)end;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&cur);
  binding = &first->binding;
  do {
    if (binding == (BindingPoint *)usedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      first_local._7_1_ = true;
LAB_02765bc2:
      local_64 = 1;
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&cur);
      return first_local._7_1_;
    }
    local_60 = binding;
    if (binding->type != TYPE_LOCATION) {
      first_local._7_1_ = false;
      goto LAB_02765bc2;
    }
    local_70._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::find
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)&cur,&binding->location);
    local_88[0]._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)&cur);
    bVar1 = std::operator!=(&local_70,local_88);
    if (bVar1) {
      first_local._7_1_ = false;
      goto LAB_02765bc2;
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)&cur,&local_60->location);
    binding = (BindingPoint *)((long)&binding[1].name.field_2 + 8);
  } while( true );
}

Assistant:

static bool areVertexArrayLocationsValid (BindingIter first, BindingIter end)
{
	std::set<int> usedLocations;
	for (BindingIter cur = first; cur != end; ++cur)
	{
		const BindingPoint& binding = cur->binding;

		if (binding.type != BindingPoint::TYPE_LOCATION)
			return false;

		if (usedLocations.find(binding.location) != usedLocations.end())
			return false;

		usedLocations.insert(binding.location);
	}

	return true;
}